

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O0

void __thiscall
PFData_test_loadClipTest3_Test::PFData_test_loadClipTest3_Test(PFData_test_loadClipTest3_Test *this)

{
  PFData_test *in_RDI;
  
  PFData_test::PFData_test(in_RDI);
  (in_RDI->super_Test)._vptr_Test = (_func_int **)&PTR__PFData_test_loadClipTest3_Test_001ae298;
  return;
}

Assistant:

TEST_F(PFData_test, loadClipTest3){

    // this file needs to exist, and should load
    char filename[2048];
    getcwd(filename,2048);
    strcat(filename,"/tests/inputs/press.init.pfb");
    PFData test(filename);
    int retval = test.loadHeader();
    ASSERT_EQ(0,retval);
    retval = test.loadClipOfData(2,2,39,39);
    ASSERT_EQ(0,retval);
    double* data = test.getData();
    EXPECT_NE(nullptr, data);
    EXPECT_NEAR(95.173603867758615, test(0, 38, 38), 1E-12);
    EXPECT_NEAR(98.006254316614971, test(0, 37, 37), 1E-12);
    test.close();
}